

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O2

err_t bakeBSTSStart(void *state,bign_params *params,bake_settings *settings,octet *privkey,
                   bake_cert *cert)

{
  u64 *puVar1;
  long lVar2;
  size_t count;
  long *plVar3;
  word *a;
  long lVar4;
  bool_t bVar5;
  err_t eVar6;
  int iVar7;
  u64 *dest;
  void *stack;
  
  bVar5 = memIsValid(params,0x150);
  eVar6 = 0x6d;
  if (((((bVar5 != 0) && (bVar5 = memIsValid(settings,0x38), bVar5 != 0)) && (settings->kca == 1))
      && ((settings->kcb == 1 &&
          ((settings->helloa == (void *)0x0 ||
           (bVar5 = memIsValid(settings->helloa,settings->helloa_len), bVar5 != 0)))))) &&
     ((settings->hellob == (void *)0x0 ||
      (bVar5 = memIsValid(settings->hellob,settings->hellob_len), bVar5 != 0)))) {
    bVar5 = bignIsOperable(params);
    if (bVar5 == 0) {
      eVar6 = 0x1f6;
    }
    else if (settings->rng == (gen_i)0x0) {
      eVar6 = 0x130;
    }
    else {
      bVar5 = memIsValid(privkey,params->l >> 2);
      if (((bVar5 != 0) && (bVar5 = memIsValid(cert,0x18), bVar5 != 0)) &&
         ((bVar5 = memIsValid(cert->data,cert->len), bVar5 != 0 &&
          (cert->val != (bake_certval_i)0x0)))) {
        eVar6 = bignStart((void *)((long)state + 0x240),params);
        if (eVar6 == 0) {
          *(void **)((long)state + 0x18) = (void *)((long)state + 0x240);
          lVar2 = *(long *)(*(long *)((long)state + 600) + 0x30);
          count = *(size_t *)(*(long *)((long)state + 600) + 0x38);
          memCopy((void *)((long)state + 0x40),params,0x150);
          memCopy((void *)((long)state + 400),settings,0x38);
          plVar3 = *(long **)((long)state + 0x18);
          dest = (u64 *)(*plVar3 + (long)plVar3);
          *(u64 **)((long)state + 0x20) = dest;
          puVar1 = dest + lVar2;
          *(u64 **)((long)state + 0x28) = puVar1;
          *(u64 **)((long)state + 0x30) = puVar1;
          *(u64 **)((long)state + 0x38) = puVar1 + lVar2;
          *(long *)state = *plVar3 + lVar2 * 0x20 + 0x240;
          *(undefined8 *)((long)state + 8) = 5;
          *(undefined8 *)((long)state + 0x10) = 1;
          u64From(dest,privkey,count);
          stack = (void *)(*state + (long)state);
          a = *(word **)((long)state + 0x38);
          eVar6 = (*cert->val)((octet *)a,params,cert->data,cert->len);
          if (eVar6 == 0) {
            lVar4 = *(long *)(*(long *)((long)state + 0x18) + 0x18);
            iVar7 = (**(code **)(lVar4 + 0x40))(a,a,lVar4,stack);
            eVar6 = 0x202;
            if (((iVar7 != 0) &&
                (lVar4 = *(long *)(*(long *)((long)state + 0x18) + 0x18),
                iVar7 = (**(code **)(lVar4 + 0x40))(a + lVar2,count + (long)a,lVar4,stack),
                iVar7 != 0)) &&
               (bVar5 = ecpIsOnA(a,*(ec_o **)((long)state + 0x18),stack), bVar5 != 0)) {
              memCopy((void *)((long)state + 0x1c8),cert,0x18);
              eVar6 = 0;
            }
          }
        }
      }
    }
  }
  return eVar6;
}

Assistant:

err_t bakeBSTSStart(void* state, const bign_params* params,
	const bake_settings* settings, const octet privkey[],
	const bake_cert* cert)
{
	err_t code;
	bake_bsts_o* s = (bake_bsts_o*)state;
	size_t n, no;
	word* Q;
	// стек
	void* stack;
	// проверить входные данные
	if (!memIsValid(params, sizeof(bign_params)) ||
		!memIsValid(settings, sizeof(bake_settings)) ||
		settings->kca != TRUE || settings->kcb != TRUE ||
		!memIsNullOrValid(settings->helloa, settings->helloa_len) ||
		!memIsNullOrValid(settings->hellob, settings->hellob_len))
		return ERR_BAD_INPUT;
	if (!bignIsOperable(params))
		return ERR_BAD_PARAMS;
	if (settings->rng == 0)
		return ERR_BAD_RNG;
	if (!memIsValid(privkey, params->l / 4) ||
		!memIsValid(cert, sizeof(bake_cert)) ||
		!memIsValid(cert->data, cert->len) ||
		cert->val == 0)
		return ERR_BAD_INPUT;
	// загрузить параметры
	code = bignStart(s->data, params);
	ERR_CALL_CHECK(code);
	s->ec = (ec_o*)s->data;
	n = s->ec->f->n, no = s->ec->f->no;
	// сохранить параметры
	memCopy(s->params, params, sizeof(bign_params));
	// сохранить настройки
	memCopy(s->settings, settings, sizeof(bake_settings));
	// настроить указатели
	s->d = objEnd(s->ec, word);
	s->u = s->d + n;
	s->t = s->u;
	s->Vb = s->u + n;
	// настроить заголовок
	s->hdr.keep = sizeof(bake_bsts_o) + objKeep(s->ec) + O_OF_W(4 * n);
	s->hdr.p_count = 5;
	s->hdr.o_count = 1;
	// загрузить личный ключ
	wwFrom(s->d, privkey, no);
	// раскладка стека
	stack = objEnd(s, void);
	// проверить сертификат и его открытый ключ
	Q = s->Vb;
	code = cert->val((octet*)Q, params, cert->data, cert->len);
	ERR_CALL_CHECK(code);
	if (!qrFrom(ecX(Q), (octet*)Q, s->ec->f, stack) ||
		!qrFrom(ecY(Q, n), (octet*)Q + no, s->ec->f, stack) ||
		!ecpIsOnA(Q, s->ec, stack))
		return ERR_BAD_CERT;
	// сохранить сертификат
	memCopy(s->cert, cert, sizeof(bake_cert));
	// все нормально
	return code;
}